

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O2

void dumpNodeEdgesToDot(PSNode *node)

{
  long *plVar1;
  uint uVar2;
  long *plVar3;
  
  plVar1 = *(long **)(node + 0x30);
  for (plVar3 = *(long **)(node + 0x28); plVar3 != plVar1; plVar3 = plVar3 + 1) {
    printf("\tNODE%u -> NODE%u [penwidth=2]\n",(ulong)*(uint *)(node + 8),
           (ulong)*(uint *)(*plVar3 + 8));
  }
  plVar1 = *(long **)(node + 0x60);
  for (plVar3 = *(long **)(node + 0x58); plVar3 != plVar1; plVar3 = plVar3 + 1) {
    printf("\tNODE%u -> NODE%u [color=blue,style=dotted,constraint=false]\n",
           (ulong)*(uint *)(*plVar3 + 8),(ulong)*(uint *)(node + 8));
  }
  uVar2 = *(uint *)(node + 0x90);
  if ((uVar2 & 0xfffffffe) == 8) {
    plVar1 = *(long **)(node + 0xf0);
    for (plVar3 = *(long **)(node + 0xe8); plVar3 != plVar1; plVar3 = plVar3 + 1) {
      printf("\tNODE%u -> NODE%u [penwidth=4,style=dashed,constraint=false]\n",
             (ulong)*(uint *)(node + 8),(ulong)*(uint *)(*(long *)(*plVar3 + 0x58) + 8));
    }
    uVar2 = *(uint *)(node + 0x90);
  }
  if (uVar2 == 0xc) {
    plVar1 = *(long **)(node + 0xf0);
    for (plVar3 = *(long **)(node + 0xe8); plVar3 != plVar1; plVar3 = plVar3 + 1) {
      printf("\tNODE%u -> NODE%u [penwidth=4,style=dashed,constraint=false]\n",
             (ulong)*(uint *)(node + 8),(ulong)*(uint *)(*plVar3 + 8));
    }
  }
  return;
}

Assistant:

static void dumpNodeEdgesToDot(PSNode *node) {
    for (PSNode *succ : node->successors()) {
        printf("\tNODE%u -> NODE%u [penwidth=2]\n", node->getID(),
               succ->getID());
    }

    for (PSNode *op : node->getOperands()) {
        printf("\tNODE%u -> NODE%u "
               "[color=blue,style=dotted,constraint=false]\n",
               op->getID(), node->getID());
    }

    if (auto *C = PSNodeCall::get(node)) {
        for (auto *const subg : C->getCallees()) {
            printf("\tNODE%u -> NODE%u "
                   "[penwidth=4,style=dashed,constraint=false]\n",
                   node->getID(), subg->root->getID());
        }
    }

    if (auto *R = PSNodeRet::get(node)) {
        for (auto *const succ : R->getReturnSites()) {
            printf("\tNODE%u -> NODE%u "
                   "[penwidth=4,style=dashed,constraint=false]\n",
                   node->getID(), succ->getID());
        }
    }
}